

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::EvalContext::Frame>::emplace_back<slang::ast::EvalContext::Frame>
          (SmallVectorBase<slang::ast::EvalContext::Frame> *this,Frame *args)

{
  size_type sVar1;
  SubroutineSymbol *pSVar2;
  SourceLocation SVar3;
  undefined8 uVar4;
  pointer pFVar5;
  
  pFVar5 = this->data_ + this->len;
  if (this->len == this->cap) {
    pFVar5 = emplaceRealloc<slang::ast::EvalContext::Frame>(this,pFVar5,args);
    return pFVar5;
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(pFVar5->temporaries)._M_t._M_impl.super__Rb_tree_header,
             &(args->temporaries)._M_t._M_impl.super__Rb_tree_header);
  pSVar2 = args->subroutine;
  SVar3 = args->callLocation;
  uVar4 = *(undefined8 *)((long)&(args->lookupLocation).scope + 4);
  *(undefined8 *)&(pFVar5->callLocation).field_0x4 = *(undefined8 *)&(args->callLocation).field_0x4;
  *(undefined8 *)((long)&(pFVar5->lookupLocation).scope + 4) = uVar4;
  pFVar5->subroutine = pSVar2;
  pFVar5->callLocation = SVar3;
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }